

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

void Kit_DsdExpandCollectAnd_rec(Kit_DsdNtk_t *p,uint iLit,uint *piLitsNew,int *nLitsNew)

{
  int iVar1;
  Kit_DsdObj_t *pKVar2;
  uint local_34;
  uint iLitFanin;
  uint i;
  Kit_DsdObj_t *pObj;
  int *nLitsNew_local;
  uint *piLitsNew_local;
  uint iLit_local;
  Kit_DsdNtk_t *p_local;
  
  iVar1 = Abc_Lit2Var(iLit);
  pKVar2 = Kit_DsdNtkObj(p,iVar1);
  iVar1 = Abc_LitIsCompl(iLit);
  if (((iVar1 == 0) && (iVar1 = Abc_Lit2Var(iLit), (int)(uint)p->nVars <= iVar1)) &&
     (((uint)*pKVar2 >> 6 & 7) == 3)) {
    for (local_34 = 0; local_34 < (uint)*pKVar2 >> 0x1a; local_34 = local_34 + 1) {
      Kit_DsdExpandCollectAnd_rec
                (p,(uint)*(ushort *)(&pKVar2[1].field_0x0 + (ulong)local_34 * 2),piLitsNew,nLitsNew)
      ;
    }
  }
  else {
    iVar1 = *nLitsNew;
    *nLitsNew = iVar1 + 1;
    piLitsNew[iVar1] = iLit;
  }
  return;
}

Assistant:

void Kit_DsdExpandCollectAnd_rec( Kit_DsdNtk_t * p, unsigned iLit, unsigned * piLitsNew, int * nLitsNew )
{
    Kit_DsdObj_t * pObj;
    unsigned i, iLitFanin;
    // check the end of the supergate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( Abc_LitIsCompl(iLit) || Abc_Lit2Var(iLit) < p->nVars || pObj->Type != KIT_DSD_AND )
    {
        piLitsNew[(*nLitsNew)++] = iLit;
        return;
    }
    // iterate through the fanins
    Kit_DsdObjForEachFanin( p, pObj, iLitFanin, i )
        Kit_DsdExpandCollectAnd_rec( p, iLitFanin, piLitsNew, nLitsNew );
}